

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fill.hpp
# Opt level: O2

map<int,_njoy::ENDFtk::section::Type<28>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>_>_>
* njoy::ENDFtk::file::Base<njoy::ENDFtk::file::Type<28>,_njoy::ENDFtk::section::Type<28>_>::fill
            (map<int,_njoy::ENDFtk::section::Type<28>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>_>_>
             *__return_storage_ptr__,
            vector<njoy::ENDFtk::section::Type<28>,_std::allocator<njoy::ENDFtk::section::Type<28>_>_>
            *sections)

{
  _Rb_tree_header *__x;
  pointer pTVar1;
  undefined8 *puVar2;
  pointer __args_1;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>_>,_bool> pVar3;
  undefined4 uStack_68;
  int MT;
  map<int,_njoy::ENDFtk::section::Type<28>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>_>_>
  map;
  
  __x = &map._M_t._M_impl.super__Rb_tree_header;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __args_1 = (sections->
             super__Vector_base<njoy::ENDFtk::section::Type<28>,_std::allocator<njoy::ENDFtk::section::Type<28>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pTVar1 = (sections->
           super__Vector_base<njoy::ENDFtk::section::Type<28>,_std::allocator<njoy::ENDFtk::section::Type<28>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__x->_M_header;
  map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__x->_M_header;
  while( true ) {
    if (__args_1 == pTVar1) {
      std::_Rb_tree_header::_Rb_tree_header
                (&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header,__x);
      std::
      _Rb_tree<int,_std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>,_std::_Select1st<std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_njoy::ENDFtk::section::Type<28>_>_>_>
      ::~_Rb_tree(&map._M_t);
      return __return_storage_ptr__;
    }
    MT = (__args_1->super_Base).MT_;
    pVar3 = std::
            _Rb_tree<int,std::pair<int_const,njoy::ENDFtk::section::Type<28>>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::section::Type<28>>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::section::Type<28>>>>
            ::_M_emplace_unique<int&,njoy::ENDFtk::section::Type<28>>
                      ((_Rb_tree<int,std::pair<int_const,njoy::ENDFtk::section::Type<28>>,std::_Select1st<std::pair<int_const,njoy::ENDFtk::section::Type<28>>>,std::less<int>,std::allocator<std::pair<int_const,njoy::ENDFtk::section::Type<28>>>>
                        *)&map,&MT,__args_1);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) break;
    __args_1 = __args_1 + 1;
  }
  tools::Log::error<char_const*>((char *)CONCAT44(MT,uStack_68));
  tools::Log::info<char_const*>((char *)CONCAT44(MT,uStack_68));
  tools::Log::info<char_const*,int>("Encountered duplicate MT: {}",MT);
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = getenv;
  __cxa_throw(puVar2,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static auto
fill( std::vector< Section >&& sections ) {

  std::map< int, Section > map;
  for ( auto&& section : sections ) {

    int MT = Derived::getSectionNumber( section );
    if ( not map.emplace( MT, std::move( section ) ).second ) {

      Log::error( "Section with duplicate section number found" );
      Log::info( "Sections are required to specify a unique MT or section number" );
      Log::info( "Encountered duplicate MT: {}", MT );
      throw std::exception();
    }
  }
  return map;
}